

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void whereIndexExprTrans(Index *pIdx,int iTabCur,int iIdxCur,WhereInfo *pWInfo)

{
  ExprList *pEVar1;
  int iVar2;
  long lVar3;
  ExprList_item *pEVar4;
  IdxExprTrans x;
  Walker local_78;
  Expr *local_48;
  int local_40;
  int local_3c;
  undefined4 local_38;
  
  pEVar1 = pIdx->aColExpr;
  if (pEVar1 != (ExprList *)0x0) {
    local_78.pParse = (Parse *)0x0;
    local_78.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_78.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_78.walkerDepth = 0;
    local_78.eCode = '\0';
    local_78._37_3_ = 0;
    local_78.xExprCallback = whereIndexExprTransNode;
    local_78.u.pNC = (NameContext *)&local_48;
    iVar2 = pEVar1->nExpr;
    if (0 < iVar2) {
      pEVar4 = pEVar1->a;
      lVar3 = 0;
      local_40 = iTabCur;
      local_3c = iIdxCur;
      do {
        if (pIdx->aiColumn[lVar3] == -2) {
          local_38 = (undefined4)lVar3;
          local_48 = pEVar4->pExpr;
          if (pWInfo->pWhere != (Expr *)0x0) {
            walkExpr(&local_78,pWInfo->pWhere);
          }
          sqlite3WalkExprList(&local_78,pWInfo->pOrderBy);
          sqlite3WalkExprList(&local_78,pWInfo->pResultSet);
          iVar2 = pEVar1->nExpr;
        }
        lVar3 = lVar3 + 1;
        pEVar4 = pEVar4 + 1;
      } while (lVar3 < iVar2);
    }
  }
  return;
}

Assistant:

static void whereIndexExprTrans(
  Index *pIdx,      /* The Index */
  int iTabCur,      /* Cursor of the table that is being indexed */
  int iIdxCur,      /* Cursor of the index itself */
  WhereInfo *pWInfo /* Transform expressions in this WHERE clause */
){
  int iIdxCol;               /* Column number of the index */
  ExprList *aColExpr;        /* Expressions that are indexed */
  Walker w;
  IdxExprTrans x;
  aColExpr = pIdx->aColExpr;
  if( aColExpr==0 ) return;  /* Not an index on expressions */
  memset(&w, 0, sizeof(w));
  w.xExprCallback = whereIndexExprTransNode;
  w.u.pIdxTrans = &x;
  x.iTabCur = iTabCur;
  x.iIdxCur = iIdxCur;
  for(iIdxCol=0; iIdxCol<aColExpr->nExpr; iIdxCol++){
    if( pIdx->aiColumn[iIdxCol]!=XN_EXPR ) continue;
    assert( aColExpr->a[iIdxCol].pExpr!=0 );
    x.iIdxCol = iIdxCol;
    x.pIdxExpr = aColExpr->a[iIdxCol].pExpr;
    sqlite3WalkExpr(&w, pWInfo->pWhere);
    sqlite3WalkExprList(&w, pWInfo->pOrderBy);
    sqlite3WalkExprList(&w, pWInfo->pResultSet);
  }
}